

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

Vec3f __thiscall
embree::CoronaLoader::load<embree::Vec3<float>>(CoronaLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  long lVar1;
  runtime_error *this_01;
  long *in_RDX;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  Vec3f VVar4;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = *(Token **)(*in_RDX + 0x98);
  lVar1 = *(long *)(*in_RDX + 0xa0) - (long)this_00;
  if (2 < (ulong)(lVar1 / 0x48)) {
    fVar2 = Token::Float(this_00,true);
    fVar3 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x48),true);
    VVar4.field_0._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x90),true);
    VVar4.field_0.field_0.y = (float)extraout_XMM0_Db;
    *(float *)&(this->path).filename._M_dataplus._M_p = fVar2;
    *(float *)((long)&(this->path).filename._M_dataplus._M_p + 4) = fVar3;
    *(float *)&(this->path).filename._M_string_length = VVar4.field_0._0_4_;
    VVar4.field_0.field_0.z = fVar3;
    return (Vec3f)VVar4.field_0;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10,xml,lVar1 % 0x48);
  ParseLocation::str_abi_cxx11_(&local_58,(ParseLocation *)(*in_RDX + 0x10));
  std::operator+(&local_38,&local_58,": wrong float3 body");
  std::runtime_error::runtime_error(this_01,(string *)&local_38);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec3f CoronaLoader::load<Vec3f>(const Ref<XML>& xml) {
    if (xml->body.size() < 3) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float3 body");
    return Vec3f(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float());
  }